

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O1

string * __thiscall czh::token::Pos::get_code_abi_cxx11_(string *__return_storage_ptr__,Pos *this)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  pointer pcVar4;
  undefined8 uVar5;
  size_type sVar6;
  string *psVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong extraout_RAX;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  bool bVar16;
  string temp1;
  string arrow;
  string temp2;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  size_type local_90;
  char local_88;
  undefined7 uStack_87;
  string *local_78;
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  long lVar10;
  
  peVar3 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar8 = (*peVar3->_vptr_File[1])(peVar3,this->pos);
  lVar10 = CONCAT44(extraout_var,iVar8);
  local_98 = (char *)(lVar10 + 3U);
  utils::to_str<unsigned_long>(&local_f8,(unsigned_long *)&local_98);
  sVar6 = local_f8._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  peVar3 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78 = __return_storage_ptr__;
  iVar9 = (*peVar3->_vptr_File[4])(peVar3);
  iVar9 = (*peVar3->_vptr_File[1])(peVar3,CONCAT44(extraout_var_00,iVar9) + -1);
  lVar13 = 4;
  do {
    lVar1 = lVar13 + -1;
    if (lVar13 == 1) break;
    lVar13 = lVar1;
  } while (iVar8 <= lVar1);
  lVar13 = 0;
  pcVar15 = (char *)(lVar10 + 3U);
  do {
    lVar14 = lVar13 + 1;
    if (lVar13 == 3) break;
    bVar16 = (char *)CONCAT44(extraout_var_01,iVar9) <= pcVar15;
    lVar13 = lVar14;
    pcVar15 = pcVar15 + -1;
  } while (bVar16);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_90 = 0;
  local_88 = '\0';
  peVar3 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98 = &local_88;
  (**peVar3->_vptr_File)(local_50,peVar3,lVar10 - lVar1,lVar10 + 1,sVar6);
  get_code_abi_cxx11_();
  if ((extraout_RAX & 1) == 0) {
    peVar3 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**peVar3->_vptr_File)(local_70,peVar3,lVar10 + 1,(lVar10 - lVar14) + 5,sVar6);
    get_code_abi_cxx11_();
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"\n","");
  peVar3 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar8 = (*peVar3->_vptr_File[2])(peVar3,this->pos);
  psVar7 = local_78;
  paVar2 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_d8,(CONCAT44(extraout_var_02,iVar8) + sVar6) - this->size,' ');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&local_b8,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_b8,"\x1b[0;32;32m");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
            (&local_b8,local_b8._M_string_length,0,this->size,'^');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_b8,"\x1b[m\n");
  std::operator+(&local_d8,&local_f8,&local_b8);
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_d8,local_98,local_90);
  (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
  pcVar4 = (pbVar11->_M_dataplus)._M_p;
  paVar12 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar12) {
    uVar5 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
    (psVar7->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
    *(undefined8 *)((long)&psVar7->field_2 + 8) = uVar5;
  }
  else {
    (psVar7->_M_dataplus)._M_p = pcVar4;
    (psVar7->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  psVar7->_M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  return psVar7;
}

Assistant:

[[nodiscard]] std::string get_code() const
    {
      std::size_t lineno = code->get_lineno(pos);
      std::size_t linenosize = utils::to_str(lineno + next).size();
      std::size_t actual_last = last;
      std::size_t actual_next = next;
      std::size_t total_line = code->get_lineno(code->size() - 1);
    
      while (static_cast<int>(lineno) - static_cast<int>(actual_last) <= 0 && actual_last > 0)
      {
        --actual_last;
      }
      while (lineno + actual_next >= total_line && actual_next > 0)
      {
        --actual_next;
      }
      
      std::string temp1, temp2;
      //lineno - actual_last is impossible to be equal lineno + 1
      temp1 = code->get_spec_line(lineno - actual_last, lineno + 1, linenosize);//[beg, end)
      if (actual_next != 0)
      {//lineno + 1 might be equal to lineno + actual_next + 1
        temp2 = code->get_spec_line(lineno + 1, lineno + actual_next + 1, linenosize);
      }
      std::string arrow("\n");
      std::size_t arrowpos = code->get_arrowpos(pos) - size + linenosize;
      arrow += std::string(arrowpos, ' ');
      arrow += "\033[0;32;32m";
      arrow.insert(arrow.end(), size, '^');
      arrow += "\033[m\n";
      return temp1 + arrow + temp2;
    }